

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-ping-udp.c
# Opt level: O1

void pinger_write_ping(pinger_t_conflict *pinger)

{
  int iVar1;
  uv_udp_t *handle;
  uv_buf_t local_18;
  
  local_18 = uv_buf_init(PING,5);
  handle = &pinger->udp;
  iVar1 = uv_udp_try_send(handle,&local_18,1,(sockaddr *)&pinger->server_addr);
  if (-1 < iVar1) {
    return;
  }
  pinger_write_ping_cold_1();
  completed_pings = completed_pings + (long)*handle->data;
  completed_pingers = completed_pingers + 1;
  free(handle->data);
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_buf_t buf;
  int r;

  buf = uv_buf_init(PING, sizeof(PING) - 1);
  r = uv_udp_try_send(&pinger->udp, &buf, 1,
                      (const struct sockaddr*) &pinger->server_addr);
  if (r < 0)
    FATAL("uv_udp_send failed");
}